

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void print_bb_insn(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn,int with_notes_p)

{
  MIR_reg_t MVar1;
  MIR_context_t ctx_00;
  FILE *__stream;
  MIR_op_t op_00;
  bool bVar2;
  int iVar3;
  dead_var_t_conflict pdVar4;
  char *pcVar5;
  dead_var_t_conflict local_88;
  dead_var_t_conflict dv;
  size_t i;
  bitmap_iterator_t bi;
  size_t nel;
  undefined8 uStack_58;
  int first_p;
  MIR_op_t op;
  MIR_context_t ctx;
  int with_notes_p_local;
  bb_insn_t_conflict bb_insn_local;
  gen_ctx_t gen_ctx_local;
  
  ctx_00 = gen_ctx->ctx;
  print_insn(gen_ctx,bb_insn->insn,0);
  fprintf((FILE *)gen_ctx->debug_file," # indexes: ");
  for (dv = (dead_var_t_conflict)0x0;
      dv < (dead_var_t_conflict)(*(ulong *)&bb_insn->insn->field_0x18 >> 0x20);
      dv = (dead_var_t_conflict)((long)&dv->var + 1)) {
    if (dv != (dead_var_t_conflict)0x0) {
      fprintf((FILE *)gen_ctx->debug_file,",");
    }
    print_op_data(gen_ctx,bb_insn->insn->ops[(long)dv].data,bb_insn);
  }
  if (with_notes_p != 0) {
    local_88 = DLIST_dead_var_t_head(&bb_insn->insn_dead_vars);
    while (local_88 != (dead_var_t_conflict)0x0) {
      MVar1 = local_88->var;
      __stream = (FILE *)gen_ctx->debug_file;
      pdVar4 = DLIST_dead_var_t_head(&bb_insn->insn_dead_vars);
      pcVar5 = " ";
      if (local_88 == pdVar4) {
        pcVar5 = " # dead: ";
      }
      fprintf(__stream,pcVar5);
      op_00.u.mem.alias = op._12_4_;
      op_00.u.reg = MVar1;
      op_00._8_8_ = CONCAT62(op.data._2_6_,(ushort)op.data) & 0xffffffffffffff00 | 2;
      op_00.data = (void *)uStack_58;
      op_00.u._8_8_ = op.u.i;
      op_00.u._16_8_ = op.u.str.s;
      op_00.u.mem.disp = op.u._16_8_;
      MIR_output_op(ctx_00,gen_ctx->debug_file,op_00,(gen_ctx->curr_func_item->u).func);
      local_88 = DLIST_dead_var_t_next(local_88);
      op.data._0_2_ = (ushort)op.data & 0xff00;
    }
    iVar3 = MIR_call_code_p((MIR_insn_code_t)*(undefined8 *)&bb_insn->insn->field_0x18);
    if (iVar3 != 0) {
      bVar2 = true;
      bitmap_iterator_init((bitmap_iterator_t *)&i,bb_insn->call_hard_reg_args);
      while (iVar3 = bitmap_iterator_next((bitmap_iterator_t *)&i,&bi.nbit), iVar3 != 0) {
        pcVar5 = " hr%ld";
        if (bVar2) {
          pcVar5 = " # call used: hr%ld";
        }
        fprintf((FILE *)gen_ctx->debug_file,pcVar5,bi.nbit);
        bVar2 = false;
      }
    }
  }
  fprintf((FILE *)gen_ctx->debug_file,"\n");
  return;
}

Assistant:

static void print_bb_insn (gen_ctx_t gen_ctx, bb_insn_t bb_insn, int with_notes_p) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_op_t op;
  int first_p;
  size_t nel;
  bitmap_iterator_t bi;

  print_insn (gen_ctx, bb_insn->insn, FALSE);
  fprintf (debug_file, " # indexes: ");
  for (size_t i = 0; i < bb_insn->insn->nops; i++) {
    if (i != 0) fprintf (debug_file, ",");
    print_op_data (gen_ctx, bb_insn->insn->ops[i].data, bb_insn);
  }
  if (with_notes_p) {
    for (dead_var_t dv = DLIST_HEAD (dead_var_t, bb_insn->insn_dead_vars); dv != NULL;
         dv = DLIST_NEXT (dead_var_t, dv)) {
      op.mode = MIR_OP_VAR;
      op.u.var = dv->var;
      fprintf (debug_file,
               dv == DLIST_HEAD (dead_var_t, bb_insn->insn_dead_vars) ? " # dead: " : " ");
      MIR_output_op (ctx, debug_file, op, curr_func_item->u.func);
    }
    if (MIR_call_code_p (bb_insn->insn->code)) {
      first_p = TRUE;
      FOREACH_BITMAP_BIT (bi, bb_insn->call_hard_reg_args, nel) {
        fprintf (debug_file, first_p ? " # call used: hr%ld" : " hr%ld", (unsigned long) nel);
        first_p = FALSE;
      }
    }
  }
  fprintf (debug_file, "\n");
}